

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void handle_2misc_narrow(DisasContext_conflict1 *s,_Bool scalar,int opcode,_Bool u,_Bool is_q,
                        int size,int rn,int rd)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *pTVar1;
  TCGv_ptr pTVar2;
  TCGTemp *pTVar3;
  DisasContext_conflict1 *pDVar4;
  TCGTemp *ts;
  TCGTemp *pTVar5;
  NeonGenNarrowEnvFn **ppNVar6;
  TCGv_i32 *ppTVar7;
  TCGv_i32 hi;
  long lVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  undefined7 in_register_00000031;
  code *func;
  undefined7 in_register_00000081;
  ulong uVar12;
  undefined4 in_register_0000008c;
  uintptr_t o_1;
  TCGv_i32 pTVar13;
  uintptr_t o;
  TCGv_i64 tcg_dest;
  uintptr_t o_5;
  TCGv_i32 ret;
  TCGTemp *local_d8;
  TCGTemp *local_d0;
  TCGTemp *local_c8;
  ulong local_b8;
  ulong local_b0;
  uint local_a4;
  MemOp local_a0;
  uint local_9c;
  TCGTemp *local_98;
  TCGTemp *local_90;
  TCGTemp *local_88;
  TCGv_i32 local_80;
  DisasContext_conflict1 *local_78;
  TCGv_i32 local_70;
  TCGv_i32 local_68;
  ulong local_60;
  TCGv_i32 local_58;
  TCGTemp *local_50;
  NeonGenNarrowEnvFn **local_48;
  NeonGenNarrowEnvFn **local_40;
  long local_38;
  
  local_b8 = CONCAT44(in_register_0000008c,size);
  local_a4 = (uint)CONCAT71(in_register_00000081,is_q);
  local_b0 = CONCAT44(local_b0._4_4_,opcode);
  uVar11 = (uint)CONCAT71(in_register_00000031,scalar);
  uVar12 = CONCAT71(in_register_00000031,scalar) & 0xffffffff;
  tcg_ctx = s->uc->tcg_ctx;
  if (uVar11 != 0) {
    local_70 = tcg_const_i32_aarch64(tcg_ctx,0);
  }
  local_a0 = (int)local_b8 + MO_16;
  local_60 = local_b8 & 0xffffffff;
  local_40 = handle_2misc_narrow::fns[local_60] + u;
  local_48 = handle_2misc_narrow::sqxtunfns + local_60;
  local_38 = (long)(rn * 0x100 + 0xc10);
  ppTVar7 = &local_68;
  lVar8 = 0;
  local_9c = uVar11;
  local_78 = s;
  bVar9 = false;
  do {
    pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    tcg_dest = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
    pTVar1 = local_78->uc->tcg_ctx;
    if ((char)uVar12 == '\0') {
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)((long)pTVar1 + (long)tcg_dest),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),local_38 + lVar8 * 8);
    }
    else {
      read_vec_element((DisasContext_conflict1 *)pTVar1,tcg_dest,rn,(int)lVar8,local_a0);
    }
    pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    pTVar13 = (TCGv_i32)((long)pTVar5 - (long)tcg_ctx);
    *ppTVar7 = pTVar13;
    if ((int)local_b0 < 0x16) {
      if ((int)local_b0 == 0x12) {
        ppNVar6 = local_48;
        if (!u) {
          (*handle_2misc_narrow::xtnfns[local_60])(tcg_ctx,pTVar13,tcg_dest);
          goto LAB_006b4109;
        }
      }
      else {
        ppNVar6 = local_40;
        if ((int)local_b0 != 0x14) {
LAB_006b4213:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,0x276e,(char *)0x0);
        }
      }
      if (*ppNVar6 != (NeonGenNarrowEnvFn *)0x0) {
        (**ppNVar6)(tcg_ctx,pTVar13,tcg_ctx->cpu_env,tcg_dest);
      }
    }
    else {
      if ((int)local_b0 == 0x16) {
        if ((int)local_b8 != 2) {
          local_88 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
          local_80 = (TCGv_i32)((long)local_88 - (long)tcg_ctx);
          local_50 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
          hi = (TCGv_i32)((long)local_50 - (long)tcg_ctx);
          local_58 = hi;
          local_90 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
          tcg_gen_addi_i64_aarch64
                    (tcg_ctx,(TCGv_i64)((long)local_90 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
                     0x2ec8);
          local_98 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
          ret = (TCGv_i32)((long)local_98 - (long)tcg_ctx);
          tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)local_98,
                              (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x2e6c);
          tcg_gen_extract_i32_aarch64(tcg_ctx,ret,ret,0x1a,1);
          tcg_gen_extr_i64_i32_aarch64(tcg_ctx,local_80,hi,tcg_dest);
          pTVar3 = local_90;
          local_d8 = local_88;
          local_d0 = local_90;
          local_c8 = local_98;
          tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_fcvt_f32_to_f16_aarch64,local_88,3,&local_d8);
          ts = local_50;
          pTVar5 = local_98;
          local_d8 = local_50;
          local_d0 = pTVar3;
          local_c8 = local_98;
          tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_fcvt_f32_to_f16_aarch64,local_50,3,&local_d8);
          tcg_gen_deposit_i32_aarch64(tcg_ctx,pTVar13,local_80,local_58,0x10,0x10);
          tcg_temp_free_internal_aarch64(tcg_ctx,local_88);
          tcg_temp_free_internal_aarch64(tcg_ctx,ts);
          tcg_temp_free_internal_aarch64(tcg_ctx,local_90);
          tcg_temp_free_internal_aarch64(tcg_ctx,pTVar5);
          goto LAB_006b4109;
        }
        pTVar2 = tcg_ctx->cpu_env;
        func = helper_vfp_fcvtsd_aarch64;
      }
      else {
        if ((int)local_b0 != 0x56) goto LAB_006b4213;
        if ((int)local_b8 != 2) {
          __assert_fail("size == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                        ,0x276a,
                        "void handle_2misc_narrow(DisasContext *, _Bool, int, _Bool, _Bool, int, int, int)"
                       );
        }
        pTVar2 = tcg_ctx->cpu_env;
        func = helper_fcvtx_f64_to_f32_aarch64;
      }
      local_d0 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      local_d8 = (TCGTemp *)((long)tcg_ctx + (long)tcg_dest);
      tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)(pTVar13 + (long)tcg_ctx),2,&local_d8);
    }
LAB_006b4109:
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
    pDVar4 = local_78;
    uVar12 = (ulong)local_9c;
    lVar8 = 1;
    ppTVar7 = &local_70;
    bVar10 = bVar9 || (local_9c & 1) != 0;
    bVar9 = true;
    if (bVar10) {
      local_b0 = (ulong)(byte)local_a4;
      uVar11 = local_a4 & 0xff;
      ppTVar7 = &local_68;
      uVar12 = 0;
      bVar9 = true;
      do {
        bVar10 = bVar9;
        pTVar13 = *ppTVar7;
        pTVar1 = pDVar4->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i32,(TCGArg)((long)&pTVar1->pool_cur + (long)pTVar13)
                            ,(TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                            uVar12 | uVar11 * 8 | (long)(rd * 0x100 + 0xc10));
        tcg_temp_free_internal_aarch64
                  (tcg_ctx,(TCGTemp *)((long)&tcg_ctx->pool_cur + (long)pTVar13));
        uVar12 = 4;
        ppTVar7 = &local_70;
        bVar9 = false;
      } while (bVar10);
      clear_vec_high((DisasContext_conflict1 *)(ulong)(uint)pDVar4->sve_len,
                     SUB81(pDVar4->uc->tcg_ctx,0),(int)local_b0);
      return;
    }
  } while( true );
}

Assistant:

static void handle_2misc_narrow(DisasContext *s, bool scalar,
                                int opcode, bool u, bool is_q,
                                int size, int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* Handle 2-reg-misc ops which are narrowing (so each 2*size element
     * in the source becomes a size element in the destination).
     */
    int pass;
    TCGv_i32 tcg_res[2];
    int destelt = is_q ? 2 : 0;
    int passes = scalar ? 1 : 2;

    if (scalar) {
        tcg_res[1] = tcg_const_i32(tcg_ctx, 0);
    }

    for (pass = 0; pass < passes; pass++) {
        TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
        NeonGenNarrowFn *genfn = NULL;
        NeonGenNarrowEnvFn *genenvfn = NULL;

        if (scalar) {
            read_vec_element(s, tcg_op, rn, pass, size + 1);
        } else {
            read_vec_element(s, tcg_op, rn, pass, MO_64);
        }
        tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

        switch (opcode) {
        case 0x12: /* XTN, SQXTUN */
        {
            static NeonGenNarrowFn * const xtnfns[3] = {
                gen_helper_neon_narrow_u8,
                gen_helper_neon_narrow_u16,
                tcg_gen_extrl_i64_i32,
            };
            static NeonGenNarrowEnvFn * const sqxtunfns[3] = {
                gen_helper_neon_unarrow_sat8,
                gen_helper_neon_unarrow_sat16,
                gen_helper_neon_unarrow_sat32,
            };
            if (u) {
                genenvfn = sqxtunfns[size];
            } else {
                genfn = xtnfns[size];
            }
            break;
        }
        case 0x14: /* SQXTN, UQXTN */
        {
            static NeonGenNarrowEnvFn * const fns[3][2] = {
                { gen_helper_neon_narrow_sat_s8,
                  gen_helper_neon_narrow_sat_u8 },
                { gen_helper_neon_narrow_sat_s16,
                  gen_helper_neon_narrow_sat_u16 },
                { gen_helper_neon_narrow_sat_s32,
                  gen_helper_neon_narrow_sat_u32 },
            };
            genenvfn = fns[size][u];
            break;
        }
        case 0x16: /* FCVTN, FCVTN2 */
            /* 32 bit to 16 bit or 64 bit to 32 bit float conversion */
            if (size == 2) {
                gen_helper_vfp_fcvtsd(tcg_ctx, tcg_res[pass], tcg_op, tcg_ctx->cpu_env);
            } else {
                TCGv_i32 tcg_lo = tcg_temp_new_i32(tcg_ctx);
                TCGv_i32 tcg_hi = tcg_temp_new_i32(tcg_ctx);
                TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);
                TCGv_i32 ahp = get_ahp_flag(tcg_ctx);

                tcg_gen_extr_i64_i32(tcg_ctx, tcg_lo, tcg_hi, tcg_op);
                gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx, tcg_lo, tcg_lo, fpst, ahp);
                gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx, tcg_hi, tcg_hi, fpst, ahp);
                tcg_gen_deposit_i32(tcg_ctx, tcg_res[pass], tcg_lo, tcg_hi, 16, 16);
                tcg_temp_free_i32(tcg_ctx, tcg_lo);
                tcg_temp_free_i32(tcg_ctx, tcg_hi);
                tcg_temp_free_ptr(tcg_ctx, fpst);
                tcg_temp_free_i32(tcg_ctx, ahp);
            }
            break;
        case 0x56:  /* FCVTXN, FCVTXN2 */
            /* 64 bit to 32 bit float conversion
             * with von Neumann rounding (round to odd)
             */
            assert(size == 2);
            gen_helper_fcvtx_f64_to_f32(tcg_ctx, tcg_res[pass], tcg_op, tcg_ctx->cpu_env);
            break;
        default:
            g_assert_not_reached();
        }

        if (genfn) {
            genfn(tcg_ctx, tcg_res[pass], tcg_op);
        } else if (genenvfn) {
            genenvfn(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env, tcg_op);
        }

        tcg_temp_free_i64(tcg_ctx, tcg_op);
    }

    for (pass = 0; pass < 2; pass++) {
        write_vec_element_i32(s, tcg_res[pass], rd, destelt + pass, MO_32);
        tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
    }
    clear_vec_high(s, is_q, rd);
}